

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_CountProximity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double distance;
  int selector;
  int iVar1;
  undefined4 extraout_var;
  AActor *pAVar3;
  char *pcVar4;
  PClass *pPVar5;
  AActor *origin;
  bool bVar6;
  PClass *pPVar2;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numret < 1) {
    return 0;
  }
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003c7be5;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003c7bcc:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003c7be5:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x2c9,
                  "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003c7aa0;
    pPVar2 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar2 == (PClass *)0x0) {
      iVar1 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar2 = (PClass *)CONCAT44(extraout_var,iVar1);
      (origin->super_DThinker).super_DObject.Class = pPVar2;
    }
    bVar6 = pPVar2 != (PClass *)0x0;
    if (pPVar2 != pPVar5 && bVar6) {
      do {
        pPVar2 = pPVar2->ParentClass;
        bVar6 = pPVar2 != (PClass *)0x0;
        if (pPVar2 == pPVar5) break;
      } while (pPVar2 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003c7be5;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003c7bcc;
LAB_003c7aa0:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003c7c04;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003c7bd5:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003c7c04:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x2ca,
                  "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pPVar5 = (PClass *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (pPVar5 == (PClass *)0x0) goto LAB_003c7b04;
    pPVar2 = pPVar5;
    if (pPVar5 != AActor::RegistrationInfo.MyClass) {
      do {
        pPVar2 = pPVar2->ParentClass;
        if (pPVar2 == AActor::RegistrationInfo.MyClass) break;
      } while (pPVar2 != (PClass *)0x0);
      if (pPVar2 == (PClass *)0x0) {
        pcVar4 = "classname == NULL || classname->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_003c7c04;
      }
    }
  }
  else {
    if (pPVar5 != (PClass *)0x0) goto LAB_003c7bd5;
LAB_003c7b04:
    pPVar5 = (PClass *)0x0;
  }
  if (numparam < 3) {
    pcVar4 = "(paramnum) < numparam";
LAB_003c7c2c:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x2cb,
                  "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar4 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_003c7c2c;
  }
  distance = param[2].field_0.f;
  if (numparam == 3) {
    param = defaultparam->Array;
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003c7c92:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x2cc,
                    "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar1 = param[3].field_0.i;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003c7c92;
    }
    iVar1 = param[3].field_0.i;
    if (4 < (uint)numparam) {
      if (param[4].field_0.field_3.Type != '\0') {
        pcVar4 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003c7c6a;
      }
      goto LAB_003c7b74;
    }
    param = defaultparam->Array;
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003c7c6a:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x2cd,
                  "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003c7b74:
  selector = param[4].field_0.i;
  pAVar3 = COPY_AAPTR(origin,selector);
  if (pAVar3 == (AActor *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = P_Thing_CheckProximity(origin,pPVar5,distance,0,iVar1,selector,true);
  }
  if (ret->RegType == '\0') {
    *(int *)ret->Location = iVar1;
    return 1;
  }
  __assert_fail("RegType == REGT_INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                ,0x13f,"void VMReturn::SetInt(int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CountProximity)
{
	if (numret > 0)
	{
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_CLASS(classname, AActor);
		PARAM_FLOAT(distance);
		PARAM_INT_DEF(flags);
		PARAM_INT_DEF(ptr);

		AActor *mobj = COPY_AAPTR(self, ptr);
		if (mobj == nullptr)
		{
			ret->SetInt(0);
		}
		else
		{
			ret->SetInt(P_Thing_CheckProximity(self, classname, distance, 0, flags, ptr, true));
		}
		return 1;
	}
	return 0;
}